

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_backup_finish(sqlite3_backup *p)

{
  int *piVar1;
  sqlite3 *db;
  sqlite3_mutex *psVar2;
  sqlite3_backup *psVar3;
  sqlite3_backup **ppsVar4;
  sqlite3_backup **ppsVar5;
  int err_code;
  
  if (p != (sqlite3_backup *)0x0) {
    db = p->pSrcDb;
    psVar2 = db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    sqlite3BtreeEnter(p->pSrc);
    if ((p->pDestDb != (sqlite3 *)0x0) &&
       ((psVar2 = p->pDestDb->mutex, psVar2 == (sqlite3_mutex *)0x0 ||
        ((*sqlite3Config.mutex.xMutexEnter)(psVar2), p->pDestDb != (sqlite3 *)0x0)))) {
      piVar1 = &p->pSrc->nBackup;
      *piVar1 = *piVar1 + -1;
    }
    if (p->isAttached != 0) {
      ppsVar4 = &p->pSrc->pBt->pPager->pBackup;
      do {
        ppsVar5 = ppsVar4;
        psVar3 = *ppsVar5;
        ppsVar4 = &psVar3->pNext;
      } while (psVar3 != p);
      *ppsVar5 = p->pNext;
    }
    sqlite3BtreeRollback(p->pDest,0,0);
    err_code = p->rc;
    if (p->rc == 0x65) {
      err_code = 0;
    }
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3Error(p->pDestDb,err_code);
      sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
    }
    sqlite3BtreeLeave(p->pSrc);
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3_free(p);
    }
    sqlite3LeaveMutexAndCloseZombie(db);
    return err_code;
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_backup_finish(sqlite3_backup *p){
  sqlite3_backup **pp;                 /* Ptr to head of pagers backup list */
  sqlite3 *pSrcDb;                     /* Source database connection */
  int rc;                              /* Value to return */

  /* Enter the mutexes */
  if( p==0 ) return SQLITE_OK;
  pSrcDb = p->pSrcDb;
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  /* Detach this backup from the source pager. */
  if( p->pDestDb ){
    p->pSrc->nBackup--;
  }
  if( p->isAttached ){
    pp = sqlite3PagerBackupPtr(sqlite3BtreePager(p->pSrc));
    while( *pp!=p ){
      pp = &(*pp)->pNext;
    }
    *pp = p->pNext;
  }

  /* If a transaction is still open on the Btree, roll it back. */
  sqlite3BtreeRollback(p->pDest, SQLITE_OK, 0);

  /* Set the error code of the destination database handle. */
  rc = (p->rc==SQLITE_DONE) ? SQLITE_OK : p->rc;
  if( p->pDestDb ){
    sqlite3Error(p->pDestDb, rc);

    /* Exit the mutexes and free the backup context structure. */
    sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
  }
  sqlite3BtreeLeave(p->pSrc);
  if( p->pDestDb ){
    /* EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    sqlite3_free(p);
  }
  sqlite3LeaveMutexAndCloseZombie(pSrcDb);
  return rc;
}